

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

void set_y_mode_and_delta_angle(int mode_idx,MB_MODE_INFO *mbmi,int reorder_delta_angle_eval)

{
  int8_t iVar1;
  uint uVar2;
  
  if (mode_idx < 0xd) {
    mbmi->mode = ""[mode_idx];
    iVar1 = '\0';
  }
  else {
    mbmi->mode = (char)((mode_idx - 0xdU) / 6) + '\x01';
    uVar2 = (mode_idx - 0xdU) % 6;
    if (reorder_delta_angle_eval == 0) {
      iVar1 = ((char)uVar2 - (uVar2 < 3)) + -2;
    }
    else {
      iVar1 = luma_delta_angles_order[uVar2];
    }
  }
  mbmi->angle_delta[0] = iVar1;
  return;
}

Assistant:

void set_y_mode_and_delta_angle(const int mode_idx, MB_MODE_INFO *const mbmi,
                                int reorder_delta_angle_eval) {
  if (mode_idx < INTRA_MODE_END) {
    mbmi->mode = intra_rd_search_mode_order[mode_idx];
    mbmi->angle_delta[PLANE_TYPE_Y] = 0;
  } else {
    mbmi->mode = (mode_idx - INTRA_MODE_END) / (MAX_ANGLE_DELTA * 2) + V_PRED;
    int delta_angle_eval_idx =
        (mode_idx - INTRA_MODE_END) % (MAX_ANGLE_DELTA * 2);
    if (reorder_delta_angle_eval) {
      mbmi->angle_delta[PLANE_TYPE_Y] =
          luma_delta_angles_order[delta_angle_eval_idx];
    } else {
      mbmi->angle_delta[PLANE_TYPE_Y] =
          (delta_angle_eval_idx < 3 ? (delta_angle_eval_idx - 3)
                                    : (delta_angle_eval_idx - 2));
    }
  }
}